

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_inotify_poller.cc
# Opt level: O1

bool __thiscall NonrecursiveInotifyPoller::AddWatch(NonrecursiveInotifyPoller *this,string *path)

{
  char *__name;
  pointer pcVar1;
  int iVar2;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  __name = (path->_M_dataplus)._M_p;
  if (__name[path->_M_string_length - 1] == '/') {
    iVar2 = inotify_add_watch(this->fd_,__name,0x7c2);
    if (-1 < iVar2) {
      pcVar1 = (path->_M_dataplus)._M_p;
      local_48._0_4_ = iVar2;
      local_40._M_p = (pointer)&local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar1,pcVar1 + path->_M_string_length);
      std::
      _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
      ::_M_insert_unique<std::pair<int_const,std::__cxx11::string>>
                ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  *)&this->directories_,
                 (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_p != &local_30) {
        operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
      }
    }
    return -1 < iVar2;
  }
  __assert_fail("path[path.size() - 1] == \'/\' && \"Directory names must end with a trailing slash\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                ,0x20,"virtual bool NonrecursiveInotifyPoller::AddWatch(const std::string &)");
}

Assistant:

bool NonrecursiveInotifyPoller::AddWatch(const std::string& path) {
  // Create new inotify watch.
  assert(path[path.size() - 1] == '/' &&
         "Directory names must end with a trailing slash");
  int watch = inotify_add_watch(
      fd_, path.c_str(), IN_CREATE | IN_DELETE | IN_DELETE_SELF | IN_MODIFY |
                             IN_MOVED_FROM | IN_MOVED_TO);
  if (watch < 0)
    return false;

  // Keep track of watch and pathname string, so we can recombine events to
  // full pathname strings.
  directories_.insert({watch, path});
  return true;
}